

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O2

bool __thiscall
SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>::is_loopback
          (WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_> *this)

{
  bool bVar1;
  endpoint_type rt;
  address local_40;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  asio::basic_socket<asio::ip::tcp>::remote_endpoint
            (&rt,&(this->Socket).super_basic_socket<asio::ip::tcp>,&ec);
  bVar1 = true;
  if (ec._M_value == 0) {
    if (rt.impl_.data_.base.sa_family != 2) {
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = rt.impl_.data_._8_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = rt.impl_.data_._9_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = rt.impl_.data_._10_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = rt.impl_.data_._11_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = rt.impl_.data_._12_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = rt.impl_.data_._13_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = rt.impl_.data_._14_1_;
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = rt.impl_.data_._15_1_;
      local_40.ipv6_address_.addr_.__in6_u._8_8_ = rt.impl_.data_._16_8_;
      local_40.ipv6_address_.scope_id_ = (unsigned_long)rt.impl_.data_.v6.sin6_scope_id;
      rt.impl_.data_.v6.sin6_flowinfo = 0;
    }
    else {
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
      local_40.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
      local_40.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_40.ipv6_address_.scope_id_ = 0;
    }
    local_40.type_ = (anon_enum_32)(rt.impl_.data_.base.sa_family != 2);
    local_40.ipv4_address_.addr_.s_addr = rt.impl_.data_.v4.sin_addr.s_addr;
    bVar1 = asio::ip::address::is_loopback(&local_40);
  }
  return bVar1;
}

Assistant:

virtual bool is_loopback() const override
        {
            std::error_code ec;
            auto rt(Socket.lowest_layer().remote_endpoint(ec));
            if (!ec)
                return rt.address().is_loopback();
            else
                return true;
        }